

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O1

Matrix3d * ear::calcBasis(Matrix3d *__return_storage_ptr__,Vector3d *position)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vector3d local_48;
  Vector3d local_28;
  
  auVar4 = *(undefined1 (*) [16])
            (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array;
  dVar2 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  auVar5._0_8_ = dVar2 * dVar2 + auVar4._8_8_ * auVar4._8_8_ + auVar4._0_8_ * auVar4._0_8_;
  auVar5._8_8_ = 0;
  auVar5 = sqrtpd(auVar5,auVar5);
  dVar3 = auVar5._0_8_;
  if (dVar3 < 1e-10) {
    auVar4 = ZEXT816(0x3ff0000000000000) << 0x40;
  }
  else {
    auVar1._8_8_ = dVar3;
    auVar1._0_8_ = dVar3;
    auVar4 = divpd(auVar4,auVar1);
  }
  *(undefined1 (*) [16])
   (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
       auVar4;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
       = (double)(~-(ulong)(dVar3 < 1e-10) & (ulong)(dVar2 / dVar3));
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar2 = azimuth(&local_28);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar3 = elevation(&local_48);
  localCoordinateSystem
            (__return_storage_ptr__,(double)(~-(ulong)(89.99999 < ABS(dVar3)) & (ulong)dVar2),dVar3)
  ;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d calcBasis(Eigen::Vector3d position) {
    position = safeNormPosition(position);
    double az = azimuth(position);
    double el = elevation(position);

    // points near the poles have indeterminate azimuth; assume 0
    if (std::abs(el) > (90.0 - 1e-5)) {
      az = 0.0;
    }
    return localCoordinateSystem(az, el);
  }